

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mipsdsp_append(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,uint32_t op1,int rt,
                       int rs,int sa)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint uVar1;
  TCGv_i64 t;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int sa_local;
  int rs_local;
  int rt_local;
  uint32_t op1_local;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  check_dsp_r2(ctx);
  if (rt != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,rs);
    if (op1 == 0x7c000031) {
      uVar1 = ctx->opcode & 0xfc0007ff;
      if (uVar1 == 0x7c000031) {
        if (sa != 0) {
          tcg_gen_deposit_i64_mips64el
                    (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,tcg_ctx_00->cpu_gpr[rt],sa,0x20 - sa);
        }
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt]);
      }
      else if (uVar1 == 0x7c000071) {
        if (sa != 0) {
          tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt]);
          tcg_gen_shri_i64_mips64el
                    (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],(long)sa);
          tcg_gen_shli_i64_mips64el(tcg_ctx_00,t,t,(long)(0x20 - sa));
          tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],t);
        }
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt]);
      }
      else if (uVar1 == 0x7c000431) {
        uVar1 = sa & 3;
        if ((uVar1 != 0) && (uVar1 != 2)) {
          tcg_gen_shli_i64_mips64el
                    (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],
                     (long)(int)(uVar1 << 3));
          tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
          tcg_gen_shri_i64_mips64el(tcg_ctx_00,t,t,(long)(int)((4 - uVar1) * 8));
          tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],t);
        }
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt]);
      }
      else {
        generate_exception_end(ctx,0x14);
      }
    }
    else if (op1 == 0x7c000035) {
      uVar1 = ctx->opcode & 0xfc0007ff;
      if (uVar1 == 0x7c000035) {
        if (sa != 0) {
          tcg_gen_deposit_i64_mips64el
                    (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,tcg_ctx_00->cpu_gpr[rt],sa,0x40 - sa);
        }
      }
      else if (uVar1 == 0x7c000075) {
        if (sa != 0) {
          tcg_gen_shri_i64_mips64el
                    (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],(long)sa);
          tcg_gen_shli_i64_mips64el(tcg_ctx_00,t,t,(long)(0x40 - sa));
          tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],t);
        }
      }
      else if (uVar1 == 0x7c0000f5) {
        tcg_gen_shri_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],(long)(int)(sa | 0x20)
                  );
        tcg_gen_shli_i64_mips64el(tcg_ctx_00,t,t,(long)(int)(0x40 - (sa | 0x20U)));
        tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],t,t);
      }
      else if (uVar1 == 0x7c000435) {
        uVar1 = sa & 7;
        if (((uVar1 != 0) && (uVar1 != 2)) && (uVar1 != 4)) {
          tcg_gen_shli_i64_mips64el
                    (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],
                     (long)(int)(uVar1 << 3));
          tcg_gen_shri_i64_mips64el(tcg_ctx_00,t,t,(long)(int)((8 - uVar1) * 8));
          tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],tcg_ctx_00->cpu_gpr[rt],t);
        }
      }
      else {
        generate_exception_end(ctx,0x14);
      }
    }
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  return;
}

Assistant:

static void gen_mipsdsp_append(CPUMIPSState *env, DisasContext *ctx,
                               uint32_t op1, int rt, int rs, int sa)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    check_dsp_r2(ctx);

    if (rt == 0) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);

    switch (op1) {
    case OPC_APPEND_DSP:
        switch (MASK_APPEND(ctx->opcode)) {
        case OPC_APPEND:
            if (sa != 0) {
                tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, tcg_ctx->cpu_gpr[rt], sa, 32 - sa);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        case OPC_PREPEND:
            if (sa != 0) {
                tcg_gen_ext32u_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
                tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], sa);
                tcg_gen_shli_tl(tcg_ctx, t0, t0, 32 - sa);
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        case OPC_BALIGN:
            sa &= 3;
            if (sa != 0 && sa != 2) {
                tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 8 * sa);
                tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
                tcg_gen_shri_tl(tcg_ctx, t0, t0, 8 * (4 - sa));
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
            break;
        default:            /* Invalid */
            MIPS_INVAL("MASK APPEND");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DAPPEND_DSP:
        switch (MASK_DAPPEND(ctx->opcode)) {
        case OPC_DAPPEND:
            if (sa != 0) {
                tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, tcg_ctx->cpu_gpr[rt], sa, 64 - sa);
            }
            break;
        case OPC_PREPENDD:
            tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 0x20 | sa);
            tcg_gen_shli_tl(tcg_ctx, t0, t0, 64 - (0x20 | sa));
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], t0, t0);
            break;
        case OPC_PREPENDW:
            if (sa != 0) {
                tcg_gen_shri_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], sa);
                tcg_gen_shli_tl(tcg_ctx, t0, t0, 64 - sa);
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            break;
        case OPC_DBALIGN:
            sa &= 7;
            if (sa != 0 && sa != 2 && sa != 4) {
                tcg_gen_shli_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], 8 * sa);
                tcg_gen_shri_tl(tcg_ctx, t0, t0, 8 * (8 - sa));
                tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt], t0);
            }
            break;
        default:            /* Invalid */
            MIPS_INVAL("MASK DAPPEND");
            generate_exception_end(ctx, EXCP_RI);
            break;
        }
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
}